

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O3

void __thiscall MainWindow::updateFloatingDisplayVisibility(MainWindow *this)

{
  FloatingDisplayVisibility FVar1;
  short sVar2;
  undefined8 extraout_RDX;
  FloatingDisplay *pFVar3;
  bool bVar4;
  
  FVar1 = getFloatingDisplayVisibility();
  if (FVar1 == FloatingDisplayVisibility_ALWAYS_HIDDEN) {
    pFVar3 = this->floatingDisplay;
    if (pFVar3 == (FloatingDisplay *)0x0) {
      return;
    }
    bVar4 = false;
  }
  else if (FVar1 == FloatingDisplayVisibility_ALWAYS_SHOWN) {
    pFVar3 = this->floatingDisplay;
    bVar4 = true;
    if (pFVar3 == (FloatingDisplay *)0x0) {
LAB_0012e409:
      showFloatingDisplay(this);
      return;
    }
  }
  else {
    pFVar3 = this->floatingDisplay;
    sVar2 = (short)*(undefined4 *)(*(long *)&this->field_0x20 + 8);
    bVar4 = -1 < sVar2;
    if (pFVar3 == (FloatingDisplay *)0x0) {
      if (sVar2 < 0) {
        return;
      }
      goto LAB_0012e409;
    }
  }
  (**(code **)(*(long *)pFVar3 + 0x68))
            (pFVar3,bVar4,extraout_RDX,*(code **)(*(long *)pFVar3 + 0x68));
  return;
}

Assistant:

void MainWindow::updateFloatingDisplayVisibility() {
	FloatingDisplayVisibility visibility = getFloatingDisplayVisibility();
	bool visible = visibility == FloatingDisplayVisibility_ALWAYS_SHOWN
		|| !(visibility == FloatingDisplayVisibility_ALWAYS_HIDDEN || isVisible());
	if (floatingDisplay == NULL) {
		if (visible) showFloatingDisplay();
	} else {
		floatingDisplay->setVisible(visible);
	}
}